

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void lj_cconv_bf_tv(CTState *cts,CType *d,uint8_t *dp,TValue *o)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *in_RDX;
  uint *in_RSI;
  CType *in_RDI;
  CTypeID did;
  uint8_t tmpbool;
  uint32_t mask;
  uint32_t val;
  CTSize bsz;
  CTSize pos;
  CTInfo info;
  ErrMsg in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 local_75;
  undefined4 local_70;
  undefined1 local_6c;
  undefined1 local_68;
  CTInfo in_stack_ffffffffffffffd4;
  TValue *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  CType *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  uVar3 = *in_RSI;
  if ((uVar3 & 0x8000000) == 0) {
    in_stack_ffffffffffffff84 = 9;
    if ((uVar3 & 0x800000) != 0) {
      in_stack_ffffffffffffff84 = 10;
    }
    lj_cconv_ct_tv((CTState *)CONCAT44(in_stack_ffffffffffffff84,in_stack_fffffffffffffff0),
                   in_stack_ffffffffffffffe8,
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  }
  else {
    lj_cconv_ct_tv((CTState *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_RDI,
                   (uint8_t *)CONCAT44(3,in_stack_ffffffffffffffe0),(TValue *)in_RDI,3);
    local_70 = (uint)local_75;
  }
  uVar1 = uVar3 >> 8 & 0x7f;
  if ((uVar3 >> 0x10 & 0x7f) << 3 < (uVar3 & 0x7f) + uVar1) {
    lj_err_caller((lua_State *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  in_stack_ffffffffffffff7c);
  }
  local_6c = (byte)uVar1;
  local_68 = (byte)(uVar3 & 0x7f);
  uVar1 = (1 << (local_6c & 0x1f)) + -1 << (local_68 & 0x1f);
  uVar2 = local_70 << (local_68 & 0x1f) & uVar1;
  uVar3 = uVar3 >> 0x10 & 0x7f;
  if (uVar3 == 1) {
    *(byte *)in_RDX = (byte)*in_RDX & ((byte)uVar1 ^ 0xff) | (byte)uVar2;
  }
  else if (uVar3 == 2) {
    *(ushort *)in_RDX = (ushort)*in_RDX & ((ushort)uVar1 ^ 0xffff) | (ushort)uVar2;
  }
  else if (uVar3 == 4) {
    *in_RDX = *in_RDX & (uVar1 ^ 0xffffffff) | uVar2;
  }
  return;
}

Assistant:

void lj_cconv_bf_tv(CTState *cts, CType *d, uint8_t *dp, TValue *o)
{
  CTInfo info = d->info;
  CTSize pos, bsz;
  uint32_t val, mask;
  lj_assertCTS(ctype_isbitfield(info), "bitfield expected");
  if ((info & CTF_BOOL)) {
    uint8_t tmpbool;
    lj_assertCTS(ctype_bitbsz(info) == 1, "bad bool bitfield size");
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_BOOL), &tmpbool, o, 0);
    val = tmpbool;
  } else {
    CTypeID did = (info & CTF_UNSIGNED) ? CTID_UINT32 : CTID_INT32;
    lj_cconv_ct_tv(cts, ctype_get(cts, did), (uint8_t *)&val, o, 0);
  }
  pos = ctype_bitpos(info);
  bsz = ctype_bitbsz(info);
  lj_assertCTS(pos < 8*ctype_bitcsz(info), "bad bitfield position");
  lj_assertCTS(bsz > 0 && bsz <= 8*ctype_bitcsz(info), "bad bitfield size");
  /* Check if a packed bitfield crosses a container boundary. */
  if (pos + bsz > 8*ctype_bitcsz(info))
    lj_err_caller(cts->L, LJ_ERR_FFI_NYIPACKBIT);
  mask = ((1u << bsz) - 1u) << pos;
  val = (val << pos) & mask;
  /* NYI: packed bitfields may cause misaligned reads/writes. */
  switch (ctype_bitcsz(info)) {
  case 4: *(uint32_t *)dp = (*(uint32_t *)dp & ~mask) | (uint32_t)val; break;
  case 2: *(uint16_t *)dp = (*(uint16_t *)dp & ~mask) | (uint16_t)val; break;
  case 1: *(uint8_t *)dp = (*(uint8_t *)dp & ~mask) | (uint8_t)val; break;
  default:
    lj_assertCTS(0, "bad bitfield container size %d", ctype_bitcsz(info));
    break;
  }
}